

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cecClass.c
# Opt level: O1

void Cec_ManSimSavePattern(Cec_ManSim_t *p,int iPat)

{
  uint uVar1;
  Vec_Int_t *pVVar2;
  Vec_Ptr_t *pVVar3;
  Abc_Cex_t *pAVar4;
  ulong uVar5;
  
  if (p->pCexComb != (Abc_Cex_t *)0x0) {
    __assert_fail("p->pCexComb == NULL",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/proof/cec/cecClass.c"
                  ,0x20a,"void Cec_ManSimSavePattern(Cec_ManSim_t *, int)");
  }
  if ((-1 < iPat) && (iPat < p->nWords << 5)) {
    pVVar2 = p->pAig->vCis;
    uVar1 = pVVar2->nSize;
    pAVar4 = (Abc_Cex_t *)
             calloc((long)(int)((((int)uVar1 >> 5) + 1) - (uint)((uVar1 & 0x1f) == 0)) * 4 + 0x14,1)
    ;
    p->pCexComb = pAVar4;
    pAVar4->iPo = p->iOut;
    pAVar4->nPis = uVar1;
    pAVar4->nBits = uVar1;
    if (0 < pVVar2->nSize) {
      pVVar3 = p->vCiSimInfo;
      uVar5 = 0;
      do {
        if ((long)pVVar3->nSize <= (long)uVar5) {
          __assert_fail("i >= 0 && i < p->nSize",
                        "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/vec/vecPtr.h"
                        ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
        }
        if ((*(uint *)((long)pVVar3->pArray[uVar5] + (ulong)((uint)iPat >> 5) * 4) &
            1 << ((byte)iPat & 0x1f)) != 0) {
          (&pAVar4[1].iPo)[uVar5 >> 5 & 0x7ffffff] =
               (&pAVar4[1].iPo)[uVar5 >> 5 & 0x7ffffff] | 1 << ((byte)uVar5 & 0x1f);
        }
        uVar5 = uVar5 + 1;
      } while ((long)uVar5 < (long)pVVar2->nSize);
    }
    return;
  }
  __assert_fail("iPat >= 0 && iPat < 32 * p->nWords",
                "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/proof/cec/cecClass.c"
                ,0x20b,"void Cec_ManSimSavePattern(Cec_ManSim_t *, int)");
}

Assistant:

void Cec_ManSimSavePattern( Cec_ManSim_t * p, int iPat )
{
    unsigned * pInfo;
    int i;
    assert( p->pCexComb == NULL );
    assert( iPat >= 0 && iPat < 32 * p->nWords );
    p->pCexComb = (Abc_Cex_t *)ABC_CALLOC( char, 
        sizeof(Abc_Cex_t) + sizeof(unsigned) * Abc_BitWordNum(Gia_ManCiNum(p->pAig)) );
    p->pCexComb->iPo = p->iOut;
    p->pCexComb->nPis = Gia_ManCiNum(p->pAig);
    p->pCexComb->nBits = Gia_ManCiNum(p->pAig);
    for ( i = 0; i < Gia_ManCiNum(p->pAig); i++ )
    {
        pInfo = (unsigned *)Vec_PtrEntry( p->vCiSimInfo, i );
        if ( Abc_InfoHasBit( pInfo, iPat ) )
            Abc_InfoSetBit( p->pCexComb->pData, i );
    }
}